

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

void __thiscall iDynTree::Model::Model(Model *this,Model *other)

{
  EVP_PKEY_CTX *src;
  
  this->_vptr_Model = (_func_int **)&PTR__Model_001e62f8;
  memset(&this->links,0,0xd8);
  ModelSolidShapes::ModelSolidShapes(&this->m_visualSolidShapes);
  ModelSolidShapes::ModelSolidShapes(&this->m_collisionSolidShapes);
  SensorsList::SensorsList(&this->m_sensors);
  copy(this,(EVP_PKEY_CTX *)other,src);
  return;
}

Assistant:

Model::Model(const Model& other)
{
    copy(other);
}